

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::FileDescriptor::dependency(FileDescriptor *this,int index)

{
  FileDescriptor *local_20;
  int local_14;
  FileDescriptor *pFStack_10;
  int index_local;
  FileDescriptor *this_local;
  
  local_14 = index;
  if (this->dependencies_once_ != (once_flag *)0x0) {
    local_20 = this;
    pFStack_10 = this;
    absl::lts_20250127::
    call_once<void(&)(google::protobuf::FileDescriptor_const*),google::protobuf::FileDescriptor_const*>
              (this->dependencies_once_,DependenciesOnceInit,&local_20);
  }
  return this->dependencies_[local_14];
}

Assistant:

const FileDescriptor* FileDescriptor::dependency(int index) const {
  if (dependencies_once_) {
    // Do once init for all indices, as it's unlikely only a single index would
    // be called, and saves on absl::call_once allocations.
    absl::call_once(*dependencies_once_, FileDescriptor::DependenciesOnceInit,
                    this);
  }
  return dependencies_[index];
}